

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O1

int Find(CMyString *CS,CMyString *s)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int *next;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  iVar1 = s->length;
  lVar7 = (long)iVar1;
  next = (int *)malloc(lVar7 * 4);
  GenKMPNext(next,s);
  bVar3 = 0 < lVar7;
  iVar5 = 0;
  if ((0 < lVar7) && (iVar5 = 0, 0 < CS->length)) {
    uVar6 = 0;
    iVar5 = 0;
    do {
      if (s->str[uVar6] == CS->str[iVar5]) {
        uVar6 = uVar6 + 1;
        iVar5 = iVar5 + 1;
      }
      else {
        uVar2 = next[uVar6];
        uVar6 = 0;
        if (0 < (int)uVar2) {
          uVar6 = uVar2;
        }
        iVar5 = iVar5 - ((int)uVar2 >> 0x1f);
      }
      bVar3 = (int)uVar6 < iVar1;
    } while (((int)uVar6 < iVar1) && (iVar5 < CS->length));
  }
  iVar4 = -1;
  if (!bVar3) {
    iVar4 = iVar5 - iVar1;
  }
  return iVar4;
}

Assistant:

int Find(CMyString *CS,CMyString *s)  //在本字符串中查找字符串s首次出现的位置，如果不包含s则返回0
{
    int i,j,*next = (int *)malloc(sizeof(int)*s->length);
    //构造模式s的next数组，详见求next数组的算法
    GenKMPNext(next,s);
    for(i = 0, j = 0; i<s->length && j<CS->length; )
    {
        if(s->str[i]==CS->str[j])
        {
            i++;
            j++;
        }
        else if(next[i]>=0)
            i = next[i];
        else
        {
            i = 0;
            j++;
        }
    }
    if(i >= s->length)
        return j-(s->length);  //匹配成功，返回子串的起始位置
    else
        return -1;  //匹配失败，返回-1
}